

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O0

bool __thiscall test_CEObservation::test_obj_return(test_CEObservation *this)

{
  CEBody *pCVar1;
  CEDate *pCVar2;
  CEObserver *pCVar3;
  long *in_RDI;
  byte bVar4;
  byte bVar5;
  CEObserver test_observer;
  CEDate test_date;
  CEBody test_body;
  CEObservation test1;
  undefined6 in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  CEObservation *in_stack_fffffffffffffbd0;
  allocator *paVar6;
  CEObserver *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  undefined4 local_358;
  allocator local_351;
  string local_350 [32];
  undefined4 local_330;
  allocator local_329;
  string local_328 [32];
  undefined4 local_308;
  allocator local_301;
  string local_300 [32];
  CEObserver local_2e0;
  CEDate local_230;
  allocator local_1e9;
  string local_1e8 [32];
  CEBody local_1c8;
  undefined4 local_178;
  allocator local_171;
  string local_170 [32];
  undefined4 local_150;
  allocator local_149;
  string local_148 [32];
  undefined4 local_128;
  allocator local_121;
  string local_120 [32];
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [32];
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [32];
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [48];
  CEObservation local_78;
  
  CEObservation::CEObservation
            (in_stack_fffffffffffffbd0,
             (CEObservation *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
  pCVar1 = CEObservation::Body(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"test_obj_return",&local_a9);
  local_b0 = 0x7d;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar1 != (CEBody *)0x0,local_a8,&local_b0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pCVar1 = CEObservation::Body(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"test_obj_return",&local_d1);
  local_d8 = 0x7e;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar1 == (CEBody *)(in_RDI + 0x44),local_d0,&local_d8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pCVar2 = CEObservation::Date(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"test_obj_return",&local_f9);
  local_100 = 0x7f;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar2 != (CEDate *)0x0,local_f8,&local_100);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pCVar2 = CEObservation::Date(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"test_obj_return",&local_121);
  local_128 = 0x80;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar2 == (CEDate *)(in_RDI + 0x4e),local_120,&local_128);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pCVar3 = CEObservation::Observer(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"test_obj_return",&local_149);
  local_150 = 0x81;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar3 != (CEObserver *)0x0,local_148,&local_150);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  pCVar3 = CEObservation::Observer(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"test_obj_return",&local_171);
  local_178 = 0x82;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar3 == (CEObserver *)(in_RDI + 0x56),local_170,&local_178)
  ;
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"",&local_1e9);
  CEBody::CEBody((CEBody *)in_stack_fffffffffffffbd0,
                 (CEBody *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  CEDate::CEDate((CEDate *)in_stack_fffffffffffffbd0,
                 (CEDate *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
  CEObserver::CEObserver
            ((CEObserver *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbd8);
  CEObservation::SetBody(&local_78,&local_1c8);
  CEObservation::SetDate(&local_78,&local_230);
  CEObservation::SetObserver(&local_78,&local_2e0);
  pCVar1 = CEObservation::Body(&local_78);
  bVar4 = pCVar1 != (CEBody *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"test_obj_return",&local_301);
  local_308 = 0x8f;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar4 & 1,local_300,&local_308);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  pCVar2 = CEObservation::Date(&local_78);
  bVar4 = pCVar2 != (CEDate *)0x0;
  paVar6 = &local_329;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"test_obj_return",paVar6);
  local_330 = 0x90;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar4 & 1,local_328,&local_330);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  pCVar3 = CEObservation::Observer(&local_78);
  bVar5 = pCVar3 != (CEObserver *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"test_obj_return",&local_351);
  local_358 = 0x91;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar5 & 1,local_350,&local_358);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  bVar4 = (**(code **)(*in_RDI + 0x18))();
  CEObserver::~CEObserver((CEObserver *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb0)));
  CEDate::~CEDate((CEDate *)0x11ea86);
  CEBody::~CEBody((CEBody *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb0)));
  CEObservation::~CEObservation
            ((CEObservation *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb0)));
  return (bool)(bVar4 & 1);
}

Assistant:

bool test_CEObservation::test_obj_return(void)
{
    // Test getting the pointers to the objects
    CEObservation test1 = base_obs_;
    test(test1.Body() != nullptr, __func__, __LINE__);
    test(test1.Body() == &base_body_, __func__, __LINE__);
    test(test1.Date() != nullptr, __func__, __LINE__);
    test(test1.Date() == &base_date_, __func__, __LINE__);
    test(test1.Observer() != nullptr, __func__, __LINE__);
    test(test1.Observer() == &base_observer_, __func__, __LINE__);

    // Copy base objects for testing (the pointers will be different)
    CEBody     test_body(base_body_);
    CEDate     test_date(base_date_);
    CEObserver test_observer(base_observer_);

    // Now reset the pointers
    test1.SetBody(&test_body);
    test1.SetDate(&test_date);
    test1.SetObserver(&test_observer);

    // Test that the pointers have been reset
    test(test1.Body() != nullptr, __func__, __LINE__);
    test(test1.Date() != nullptr, __func__, __LINE__);
    test(test1.Observer() != nullptr, __func__, __LINE__);

    return pass();
}